

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_remove_back_n(void)

{
  int array [4];
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 auStack_3c [3];
  
  local_48 = 0xb;
  uStack_44 = 0x16;
  uStack_40 = 0x21;
  auStack_3c[0] = 0x2c;
  local_58 = 4;
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf1,"void api_dynamic_suite::dynamic_remove_back_n()",&local_58,&local_4c);
  local_58 = CONCAT44(local_58._4_4_,0x2c);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf2,"void api_dynamic_suite::dynamic_remove_back_n()",auStack_3c,&local_58);
  local_58 = 2;
  local_4c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf4,"void api_dynamic_suite::dynamic_remove_back_n()",&local_58,&local_4c);
  local_58 = CONCAT44(local_58._4_4_,0x16);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf5,"void api_dynamic_suite::dynamic_remove_back_n()",&uStack_44,&local_58);
  return;
}

Assistant:

void dynamic_remove_back_n()
{
    int array[4] = { 11, 22, 33, 44 };
    vista::span<int> span(array);
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.back(), 44);
    span.remove_back(2);
    BOOST_TEST_EQ(span.size(), 2);
    BOOST_TEST_EQ(span.back(), 22);
}